

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::BuilderT(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
           *this,MemoryMonitorInterface *device,Scene *recalculatePrimRef,FastAllocator *createAlloc
          ,BVH *param_5,long param_6,undefined4 *param_7)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 *puVar16;
  allocator local_39;
  string local_38 [32];
  
  uVar1 = *param_7;
  uVar2 = param_7[1];
  uVar3 = param_7[2];
  uVar4 = param_7[3];
  uVar5 = param_7[4];
  uVar6 = param_7[5];
  uVar7 = param_7[6];
  uVar8 = param_7[7];
  uVar9 = param_7[8];
  uVar10 = param_7[9];
  fVar11 = (float)param_7[10];
  fVar12 = (float)param_7[0xb];
  uVar13 = param_7[0xd];
  uVar14 = param_7[0xe];
  uVar15 = param_7[0xf];
  *(undefined4 *)&(this->cfg).singleLeafTimeSegment = param_7[0xc];
  *(undefined4 *)&(this->cfg).field_0x34 = uVar13;
  *(undefined4 *)&(this->cfg).singleThreadThreshold = uVar14;
  *(undefined4 *)((long)&(this->cfg).singleThreadThreshold + 4) = uVar15;
  *(undefined4 *)&(this->cfg).maxLeafSize = uVar9;
  *(undefined4 *)((long)&(this->cfg).maxLeafSize + 4) = uVar10;
  (this->cfg).travCost = fVar11;
  (this->cfg).intCost = fVar12;
  *(undefined4 *)&(this->cfg).logBlockSize = uVar5;
  *(undefined4 *)((long)&(this->cfg).logBlockSize + 4) = uVar6;
  *(undefined4 *)&(this->cfg).minLeafSize = uVar7;
  *(undefined4 *)((long)&(this->cfg).minLeafSize + 4) = uVar8;
  *(undefined4 *)&(this->cfg).branchingFactor = uVar1;
  *(undefined4 *)((long)&(this->cfg).branchingFactor + 4) = uVar2;
  *(undefined4 *)&(this->cfg).maxDepth = uVar3;
  *(undefined4 *)((long)&(this->cfg).maxDepth + 4) = uVar4;
  (this->heuristicTemporalSplit).device = device;
  (this->heuristicTemporalSplit).recalculatePrimRef.scene = recalculatePrimRef;
  (this->recalculatePrimRef).scene = recalculatePrimRef;
  (this->createAlloc).super_Create.allocator = createAlloc;
  (this->createLeaf).bvh = param_5;
  (this->progressMonitor).super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___021d4948;
  (this->progressMonitor).scene = *(Scene **)(param_6 + 8);
  if ((this->cfg).branchingFactor < 0x11) {
    return;
  }
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_38,"bvh_builder: branching factor too large",&local_39);
  *puVar16 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar16 + 1) = 1;
  std::__cxx11::string::string((string *)(puVar16 + 2),local_38);
  __cxa_throw(puVar16,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BuilderT (MemoryMonitorInterface* device,
                    const RecalculatePrimRef recalculatePrimRef,
                    const CreateAllocFunc createAlloc,
                    const CreateNodeFunc createNode,
                    const SetNodeFunc setNode,
                    const CreateLeafFunc createLeaf,
                    const ProgressMonitor progressMonitor,
                    const Settings& settings)
            : cfg(settings),
            heuristicObjectSplit(),
            heuristicTemporalSplit(device, recalculatePrimRef),
            recalculatePrimRef(recalculatePrimRef), createAlloc(createAlloc), createNode(createNode), setNode(setNode), createLeaf(createLeaf),
            progressMonitor(progressMonitor)
          {
            if (cfg.branchingFactor > MAX_BRANCHING_FACTOR)
              throw_RTCError(RTC_ERROR_UNKNOWN,"bvh_builder: branching factor too large");
          }